

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.h
# Opt level: O2

bool google::protobuf::compiler::csharp::IsDescriptorOptionMessage(Descriptor *descriptor)

{
  bool bVar1;
  bool bVar2;
  string name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_28;
  
  bVar1 = IsDescriptorProto(*(FileDescriptor **)(descriptor + 0x10));
  if (bVar1) {
    std::__cxx11::string::string((string *)&bStack_28,*(string **)(descriptor + 8));
    bVar2 = std::operator==(&bStack_28,"google.protobuf.FileOptions");
    bVar1 = true;
    if (!bVar2) {
      bVar2 = std::operator==(&bStack_28,"google.protobuf.MessageOptions");
      if (!bVar2) {
        bVar2 = std::operator==(&bStack_28,"google.protobuf.FieldOptions");
        if (!bVar2) {
          bVar2 = std::operator==(&bStack_28,"google.protobuf.OneofOptions");
          if (!bVar2) {
            bVar2 = std::operator==(&bStack_28,"google.protobuf.EnumOptions");
            if (!bVar2) {
              bVar2 = std::operator==(&bStack_28,"google.protobuf.EnumValueOptions");
              if (!bVar2) {
                bVar2 = std::operator==(&bStack_28,"google.protobuf.ServiceOptions");
                if (!bVar2) {
                  bVar1 = std::operator==(&bStack_28,"google.protobuf.MethodOptions");
                }
              }
            }
          }
        }
      }
    }
    std::__cxx11::string::~string((string *)&bStack_28);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

inline bool IsDescriptorOptionMessage(const Descriptor* descriptor) {
  if (!IsDescriptorProto(descriptor->file())) {
    return false;
  }
  const string name = descriptor->full_name();
  return name == "google.protobuf.FileOptions" ||
      name == "google.protobuf.MessageOptions" ||
      name == "google.protobuf.FieldOptions" ||
      name == "google.protobuf.OneofOptions" ||
      name == "google.protobuf.EnumOptions" ||
      name == "google.protobuf.EnumValueOptions" ||
      name == "google.protobuf.ServiceOptions" ||
      name == "google.protobuf.MethodOptions";
}